

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgesture.cpp
# Opt level: O2

void QSwipeGesture::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  SwipeDirection *pSVar1;
  SwipeDirection SVar2;
  undefined8 uVar3;
  
  if (_c == WriteProperty) {
    if (_id == 3) {
      *(undefined8 *)(*(long *)(_o + 8) + 0xd8) = **_a;
      return;
    }
    if (_id != 2) {
      return;
    }
    *(undefined8 *)(*(long *)(_o + 8) + 0xb0) = **_a;
    return;
  }
  if (_c != ReadProperty) {
    return;
  }
  if (3 < (uint)_id) {
    return;
  }
  pSVar1 = (SwipeDirection *)*_a;
  switch(_id) {
  case 0:
    SVar2 = horizontalDirection((QSwipeGesture *)_o);
    break;
  case 1:
    SVar2 = verticalDirection((QSwipeGesture *)_o);
    break;
  case 2:
    uVar3 = *(undefined8 *)(*(long *)(_o + 8) + 0xb0);
    goto LAB_002cd496;
  case 3:
    uVar3 = *(undefined8 *)(*(long *)(_o + 8) + 0xd8);
LAB_002cd496:
    *(undefined8 *)pSVar1 = uVar3;
    return;
  }
  *pSVar1 = SVar2;
  return;
}

Assistant:

void QSwipeGesture::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSwipeGesture *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<SwipeDirection*>(_v) = _t->horizontalDirection(); break;
        case 1: *reinterpret_cast<SwipeDirection*>(_v) = _t->verticalDirection(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->swipeAngle(); break;
        case 3: *reinterpret_cast<qreal*>(_v) = _t->QSwipeGesture::d_func()->velocity(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 2: _t->setSwipeAngle(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->QSwipeGesture::d_func()->setVelocity(*reinterpret_cast<qreal*>(_v)); break;
        default: break;
        }
    }
}